

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

bool VerifyTaprootCommitment
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *control,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *program,uint256 *tapleaf_hash)

{
  pointer puVar1;
  pointer __src;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  Span<const_unsigned_char> control_00;
  uint256 merkle_root;
  XOnlyPubKey q;
  XOnlyPubKey p;
  uint256 uStack_98;
  XOnlyPubKey local_78;
  XOnlyPubKey local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = (control->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (long)(control->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                .super__Vector_impl_data._M_finish - (long)puVar1;
  if (uVar4 < 0x21) {
    __assert_fail("control.size() >= TAPROOT_CONTROL_BASE_SIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                  ,0x745,
                  "bool VerifyTaprootCommitment(const std::vector<unsigned char> &, const std::vector<unsigned char> &, const uint256 &)"
                 );
  }
  __src = (program->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start;
  uVar3 = (long)(program->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                .super__Vector_impl_data._M_finish - (long)__src;
  if (uVar3 < 0x20) {
    __assert_fail("program.size() >= uint256::size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                  ,0x746,
                  "bool VerifyTaprootCommitment(const std::vector<unsigned char> &, const std::vector<unsigned char> &, const uint256 &)"
                 );
  }
  local_58.m_keydata.super_base_blob<256U>.m_data._M_elems._0_8_ = *(undefined8 *)(puVar1 + 1);
  local_58.m_keydata.super_base_blob<256U>.m_data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 9);
  local_58.m_keydata.super_base_blob<256U>.m_data._M_elems._16_8_ = *(undefined8 *)(puVar1 + 0x11);
  local_58.m_keydata.super_base_blob<256U>.m_data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 0x19);
  if (uVar3 != 0x20) {
    __assert_fail("vch.size() == WIDTH",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/uint256.h"
                  ,0x2a,"base_blob<256>::base_blob(Span<const unsigned char>) [BITS = 256]");
  }
  memmove(&local_78,__src,0x20);
  control_00.m_size = uVar4;
  control_00.m_data = puVar1;
  ComputeTaprootMerkleRoot(&uStack_98,control_00,tapleaf_hash);
  bVar2 = XOnlyPubKey::CheckTapTweak
                    (&local_78,&local_58,&uStack_98,
                     (bool)(*(control->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start & 1));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

static bool VerifyTaprootCommitment(const std::vector<unsigned char>& control, const std::vector<unsigned char>& program, const uint256& tapleaf_hash)
{
    assert(control.size() >= TAPROOT_CONTROL_BASE_SIZE);
    assert(program.size() >= uint256::size());
    //! The internal pubkey (x-only, so no Y coordinate parity).
    const XOnlyPubKey p{Span{control}.subspan(1, TAPROOT_CONTROL_BASE_SIZE - 1)};
    //! The output pubkey (taken from the scriptPubKey).
    const XOnlyPubKey q{program};
    // Compute the Merkle root from the leaf and the provided path.
    const uint256 merkle_root = ComputeTaprootMerkleRoot(control, tapleaf_hash);
    // Verify that the output pubkey matches the tweaked internal pubkey, after correcting for parity.
    return q.CheckTapTweak(p, merkle_root, control[0] & 1);
}